

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O0

float Abc_NtkComputeNodeDeparture(Abc_Obj_t *pObj,float Slew)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  float fVar2;
  int local_24;
  int i;
  Abc_Obj_t *pFanout;
  float Slew_local;
  Abc_Obj_t *pObj_local;
  
  fVar2 = Bus_SclObjDept(pObj);
  if ((fVar2 == 0.0) && (!NAN(fVar2))) {
    for (local_24 = 0; iVar1 = Abc_ObjFanoutNum(pObj), local_24 < iVar1; local_24 = local_24 + 1) {
      pObj_00 = Abc_ObjFanout(pObj,local_24);
      iVar1 = Abc_ObjIsBarBuf(pObj_00);
      if (iVar1 == 0) {
        iVar1 = Abc_ObjIsCo(pObj_00);
        if (iVar1 == 0) {
          iVar1 = Abc_NodeFindFanin(pObj_00,pObj);
          fVar2 = Abc_NtkComputeEdgeDept(pObj_00,iVar1,Slew);
          Bus_SclObjUpdateDept(pObj,fVar2);
        }
      }
      else {
        fVar2 = Bus_SclObjDept(pObj_00);
        Bus_SclObjUpdateDept(pObj,fVar2);
      }
    }
    fVar2 = Bus_SclObjDept(pObj);
    return fVar2;
  }
  __assert_fail("Bus_SclObjDept(pObj) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclBufSize.c"
                ,0xb6,"float Abc_NtkComputeNodeDeparture(Abc_Obj_t *, float)");
}

Assistant:

float Abc_NtkComputeNodeDeparture( Abc_Obj_t * pObj, float Slew )
{
    Abc_Obj_t * pFanout;
    int i;
    assert( Bus_SclObjDept(pObj) == 0 );
    Abc_ObjForEachFanout( pObj, pFanout, i )
    {
        if ( Abc_ObjIsBarBuf(pFanout) )
            Bus_SclObjUpdateDept( pObj, Bus_SclObjDept(pFanout) );
        else if ( !Abc_ObjIsCo(pFanout) ) // add required times here
            Bus_SclObjUpdateDept( pObj, Abc_NtkComputeEdgeDept(pFanout, Abc_NodeFindFanin(pFanout, pObj), Slew) );
    }
    return Bus_SclObjDept( pObj );
}